

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugWriter.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::DebugWriter::PrintEscapedString(DebugWriter *this,Char *str,CharCount len)

{
  Char *pCVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Char *p;
  
  if (str == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/DebugWriter.cpp"
                       ,0x2c,"(str != 0)","str != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (this->nlPending == true) {
    Output::Print(L"\n%*s",(ulong)(uint)(this->indent << 2),L"");
    this->nlPending = false;
  }
  pCVar1 = str + len;
  if (str < pCVar1) {
    do {
      if (*str == L'\"') {
        Output::Print(L"\\\"");
      }
      else {
        PrintEscapedChar(this,*str);
      }
      str = str + 1;
    } while (str < pCVar1);
  }
  return;
}

Assistant:

void DebugWriter::PrintEscapedString(const Char* str, CharCount len)
    {
        Assert(str != 0);
        CheckForNewline();

        const Char* pl = str + len;
        for (const Char* p = str; p < pl; p++)
        {
            if (*p == '"')
                Output::Print(_u("\\\""));
            else
                PrintEscapedChar(*p);
        }
    }